

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextbookBoyerMoore.cpp
# Opt level: O3

int32 * UnifiedRegex::TextbookBoyerMooreSetup<char16_t>::GetGoodSuffix
                  (ArenaAllocator *allocator,Char *pat,CharCount patLen,int skip)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  BOOL BVar4;
  ulong count;
  undefined4 *puVar5;
  int *obj;
  ulong uVar6;
  int32 *extraout_RAX;
  int32 *extraout_RAX_00;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  void *buffer;
  size_t requestedBytes;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this;
  uint uVar10;
  int32 *__dest;
  int *local_40;
  
  count = (ulong)patLen;
  if (patLen == 0) {
    _DAT_00000008 = 0;
    local_40 = (int *)&DAT_00000008;
    uVar10 = 1;
    obj = (int *)&DAT_00000008;
  }
  else {
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_00f05b92;
      *puVar5 = 0;
    }
    requestedBytes = count * 4;
    local_40 = (int *)Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                      AllocInternal(&allocator->
                                     super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                    ,requestedBytes);
    if (local_40 == (int *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) goto LAB_00f05b92;
      *puVar5 = 0;
    }
    *local_40 = 0;
    uVar6 = 0;
    bVar2 = patLen != 1;
    if (patLen == 1) {
LAB_00f058d8:
      bVar2 = SUB81(uVar6,0);
      BVar4 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar3) goto LAB_00f05b92;
        *puVar5 = 0;
      }
      this = &allocator->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      obj = (int *)Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                   AllocInternal(&allocator->
                                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                 ,requestedBytes);
      if (obj == (int *)0x0) {
        GetGoodSuffix();
        if (requestedBytes == 0) {
          return extraout_RAX;
        }
        if ((requestedBytes * 4) / requestedBytes != 4) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                             ,0x195,"(count * sizeof(T) / count == sizeof(T))",
                             "count * sizeof(T) / count == sizeof(T)");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar5 = 0;
        }
        Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                  (this,buffer,requestedBytes * 4);
        return extraout_RAX_00;
      }
    }
    else {
      uVar7 = 1;
      do {
        uVar8 = (int)uVar7 * skip;
        uVar10 = (uint)uVar6;
        if (0 < (int)uVar10) {
          do {
            uVar10 = (uint)uVar6;
            if (pat[(int)(uVar10 * skip)] == pat[uVar8]) break;
            uVar10 = local_40[uVar6 - 1];
            uVar6 = (ulong)uVar10;
          } while (0 < (int)uVar10);
        }
        uVar10 = uVar10 + (pat[(int)(uVar10 * skip)] == pat[uVar8]);
        uVar6 = (ulong)uVar10;
        local_40[uVar7] = uVar10;
        uVar7 = uVar7 + 1;
      } while (uVar7 != count);
      uVar6 = (ulong)bVar2;
      if (patLen != 0) goto LAB_00f058d8;
      obj = (int *)&DAT_00000008;
    }
    *obj = 0;
    if (bVar2 != false) {
      uVar10 = 0;
      uVar6 = 1;
      do {
        uVar8 = (~(uint)uVar6 + patLen) * skip;
        if (0 < (int)uVar10) {
          do {
            if (pat[(~uVar10 + patLen) * skip] == pat[uVar8]) break;
            uVar10 = obj[(ulong)uVar10 - 1];
          } while (0 < (int)uVar10);
        }
        uVar10 = uVar10 + (pat[(~uVar10 + patLen) * skip] == pat[uVar8]);
        obj[uVar6] = uVar10;
        uVar6 = uVar6 + 1;
      } while (uVar6 != count);
    }
    uVar10 = patLen + 1;
    if (uVar10 == 0) {
      uVar10 = 0;
      __dest = (int32 *)&DAT_00000008;
      goto LAB_00f05ad7;
    }
  }
  BVar4 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar4 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                       "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar2) goto LAB_00f05b92;
    *puVar5 = 0;
  }
  __dest = (int32 *)Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                    AllocInternal(&allocator->
                                   super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                  ,(ulong)uVar10 << 2);
  if (__dest == (int32 *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar2) {
LAB_00f05b92:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
    __dest = (int32 *)0x0;
  }
LAB_00f05ad7:
  uVar6 = 0;
  do {
    __dest[uVar6] = patLen - local_40[patLen - 1];
    uVar6 = uVar6 + 1;
  } while (uVar10 + (uVar10 == 0) != uVar6);
  if (patLen != 0) {
    uVar6 = 2;
    if (2 < uVar10) {
      uVar6 = (ulong)uVar10;
    }
    uVar7 = 1;
    do {
      uVar10 = patLen - obj[uVar7 - 1];
      iVar9 = (int)uVar7 - obj[uVar7 - 1];
      if (iVar9 < __dest[uVar10]) {
        __dest[uVar10] = iVar9;
      }
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
    if (patLen != 0) {
      memmove(__dest,__dest + 1,count * 4);
    }
  }
  Memory::DeleteArray<Memory::ArenaAllocator,int>(allocator,count,local_40);
  Memory::DeleteArray<Memory::ArenaAllocator,int>(allocator,count,obj);
  return __dest;
}

Assistant:

int32 * TextbookBoyerMooreSetup<C>::GetGoodSuffix(ArenaAllocator* allocator, const Char * pat, CharCount patLen, int skip)
    {
        // pat offset q |-> longest prefix of pat which is a proper suffix of pat[0..q]
        // (thanks to equivalence classes being in canonical order we only need to look at the first
        //  character of each skip grouping in the pattern)
        int32* prefix = AnewArray(allocator, int32, patLen);
        prefix[0] = 0;
        int32 k = 0;
        for (CharCount q = 1; q < patLen; q++)
        {
            while (k > 0 && pat[k * skip] != pat[q * skip])
                k = prefix[k - 1];
            if (pat[k * skip] == pat[q * skip])
                k++;
            prefix[q] = k;
        }

        // As above, but for rev(pat)
        int32* revPrefix = AnewArray(allocator, int32, patLen);
        revPrefix[0] = 0;
        k = 0;
        for (CharCount q = 1; q < patLen; q++)
        {
            while (k > 0 && pat[(patLen - k - 1) * skip] != pat[(patLen - q - 1) * skip])
                k = revPrefix[k - 1];
            if (pat[(patLen - k - 1) * skip] == pat[(patLen - q - 1) * skip])
                k++;
            revPrefix[q] = k;
        }

        // pat prefix length l |-> least shift s.t. pat[0..l-1] is not mismatched
        int32 * goodSuffix = AnewArray(allocator, int32, patLen + 1);
        for (CharCount j = 0; j <= patLen; j++)
            goodSuffix[j] = patLen - prefix[patLen - 1];
        for (CharCount l = 1; l <= patLen; l++)
        {
            CharCount j = patLen - revPrefix[l - 1];
            int32 s = l - revPrefix[l - 1];
            if (goodSuffix[j] > s)
                goodSuffix[j] = s;
        }
        // shift above one to the left
        for (CharCount j = 0; j < patLen; j++)
            goodSuffix[j] = goodSuffix[j + 1];

        AdeleteArray(allocator, patLen, prefix);
        AdeleteArray(allocator, patLen, revPrefix);

        return goodSuffix;
    }